

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.c
# Opt level: O3

void handle_device_fd(int fd)

{
  char cVar1;
  listnode *__s2;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  __pid_t _Var6;
  ssize_t sVar7;
  undefined4 extraout_var;
  size_t sVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  listnode *plVar14;
  char *pcVar15;
  uint local_4d8;
  uint uid;
  undefined8 local_4d0;
  mode_t perm;
  int local_4c4;
  uevent uevent;
  char local_498 [96];
  char msg [1026];
  
  sVar7 = recv(fd,msg,0x400,0);
  iVar3 = (int)sVar7;
  local_4c4 = fd;
  do {
    if (iVar3 < 1) {
      return;
    }
    pcVar10 = msg;
    pcVar15 = "";
    uVar4 = (uint)sVar7;
    if (uVar4 != 0x400) {
      msg[uVar4 & 0x7fffffff] = '\0';
      msg[uVar4 + 1] = '\0';
      uevent.action = "";
      uevent.path = "";
      uevent.subsystem = "";
      uevent.firmware = "";
      uevent.major = -1;
      uevent.minor = -1;
      if (msg[0] == '\0') {
        local_4d0 = 0xffffffff;
        uVar9 = 0xffffffff;
        pcVar11 = "";
        pcVar13 = "";
        pcVar12 = "";
      }
      else {
        local_4d0 = 0xffffffff;
        uVar9 = 0xffffffff;
        pcVar11 = "";
        pcVar13 = "";
        pcVar12 = "";
        do {
          iVar3 = strncmp(pcVar10,"ACTION=",7);
          if (iVar3 == 0) {
            pcVar10 = pcVar10 + 7;
            pcVar15 = pcVar10;
            uevent.action = pcVar10;
          }
          else {
            iVar3 = strncmp(pcVar10,"DEVPATH=",8);
            if (iVar3 == 0) {
              pcVar10 = pcVar10 + 8;
              pcVar12 = pcVar10;
              uevent.path = pcVar10;
            }
            else {
              iVar3 = strncmp(pcVar10,"SUBSYSTEM=",10);
              if (iVar3 == 0) {
                pcVar10 = pcVar10 + 10;
                pcVar13 = pcVar10;
                uevent.subsystem = pcVar10;
              }
              else {
                iVar3 = strncmp(pcVar10,"FIRMWARE=",9);
                if (iVar3 == 0) {
                  pcVar10 = pcVar10 + 9;
                  pcVar11 = pcVar10;
                  uevent.firmware = pcVar10;
                }
                else {
                  iVar3 = strncmp(pcVar10,"MAJOR=",6);
                  if (iVar3 == 0) {
                    pcVar10 = pcVar10 + 6;
                    uVar4 = atoi(pcVar10);
                    uVar9 = (ulong)uVar4;
                    uevent.major = uVar4;
                  }
                  else {
                    iVar3 = strncmp(pcVar10,"MINOR=",6);
                    if (iVar3 == 0) {
                      pcVar10 = pcVar10 + 6;
                      iVar3 = atoi(pcVar10);
                      local_4d0 = CONCAT44(extraout_var,iVar3);
                      uevent.minor = iVar3;
                    }
                  }
                }
              }
            }
          }
          do {
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar1 != '\0');
        } while (*pcVar10 != '\0');
      }
      log_write(6,"<6>init: event { \'%s\', \'%s\', \'%s\', \'%s\', %d, %d }\n",pcVar15,pcVar12,
                pcVar13,pcVar11,uVar9,local_4d0);
      iVar3 = uevent.major;
      if (((-1 < uevent.major) && (iVar2 = uevent.minor, -1 < (long)uevent._32_8_)) &&
         (pcVar10 = strrchr(uevent.path,0x2f), pcVar10 != (char *)0x0)) {
        pcVar15 = pcVar10 + 1;
        sVar8 = strlen(pcVar15);
        pcVar11 = uevent.subsystem;
        if (sVar8 < 0x41) {
          iVar5 = strncmp(uevent.subsystem,"block",5);
          local_4d0 = CONCAT44(local_4d0._4_4_,iVar5);
          if (iVar5 == 0) {
            pcVar11 = "/dev/block/";
LAB_00107d60:
            mkdir(pcVar11,0x1ed);
          }
          else {
            iVar5 = strncmp(pcVar11,"graphics",8);
            if (iVar5 == 0) {
              pcVar11 = "/dev/graphics/";
              goto LAB_00107d60;
            }
            iVar5 = strncmp(pcVar11,"oncrpc",6);
            if (iVar5 == 0) {
              pcVar11 = "/dev/oncrpc/";
              goto LAB_00107d60;
            }
            iVar5 = strncmp(pcVar11,"adsp",4);
            if (iVar5 == 0) {
              pcVar11 = "/dev/adsp/";
              goto LAB_00107d60;
            }
            iVar5 = strncmp(pcVar11,"msm_camera",10);
            if (iVar5 == 0) {
              pcVar11 = "/dev/msm_camera/";
              goto LAB_00107d60;
            }
            iVar5 = strncmp(pcVar11,"input",5);
            if (iVar5 == 0) {
              pcVar11 = "/dev/input/";
              goto LAB_00107d60;
            }
            if (((*pcVar11 == 'm') && (pcVar11[1] == 't')) && (pcVar11[2] == 'd')) {
              pcVar11 = "/dev/mtd/";
              goto LAB_00107d60;
            }
            iVar5 = strncmp(pcVar11,"sound",5);
            if (iVar5 == 0) {
              pcVar11 = "/dev/snd/";
              goto LAB_00107d60;
            }
            iVar5 = strncmp(pcVar11,"misc",4);
            if (iVar5 == 0) {
              iVar5 = strncmp(pcVar15,"log_",4);
              pcVar11 = "/dev/";
              if (iVar5 == 0) {
                mkdir("/dev/log/",0x1ed);
                pcVar15 = pcVar10 + 5;
                pcVar11 = "/dev/log/";
              }
            }
            else {
              pcVar11 = "/dev/";
            }
          }
          snprintf(local_498,0x60,"%s%s",pcVar11,pcVar15);
          pcVar10 = uevent.action;
          iVar5 = strcmp(uevent.action,"add");
          if (iVar5 == 0) {
            if ((uint)(iVar2 | iVar3) < 0x100) {
              iVar5 = get_device_perm_inner(qemu_perms,local_498,&uid,&local_4d8,&perm);
              uVar4 = perm;
              if ((iVar5 != 0) &&
                 (iVar5 = get_device_perm_inner(devperms,local_498,&uid,&local_4d8,&perm),
                 plVar14 = devperms_partners.next, uVar4 = perm, iVar5 != 0)) {
                for (; plVar14 != &devperms_partners; plVar14 = plVar14->next) {
                  __s2 = plVar14[-2].prev;
                  if (*(short *)((long)&plVar14[-1].prev + 4) == 0) {
                    iVar5 = strcmp(local_498,(char *)__s2);
                  }
                  else {
                    sVar8 = strlen((char *)__s2);
                    iVar5 = strncmp(local_498,(char *)__s2,sVar8);
                  }
                  if (iVar5 == 0) {
                    uid = *(uint *)((long)&plVar14[-1].next + 4);
                    local_4d8 = *(uint *)&plVar14[-1].prev;
                    uVar4 = *(uint *)&plVar14[-1].next;
                    goto LAB_00107e9b;
                  }
                }
                uid = 0;
                local_4d8 = 0;
                uVar4 = 0x180;
              }
LAB_00107e9b:
              mknod(local_498,(uint)((int)local_4d0 == 0) << 0xe | uVar4 | 0x2000,
                    (ulong)(uint)(iVar2 | iVar3 << 8));
              chown(local_498,uid,local_4d8);
            }
          }
          else {
            iVar3 = strcmp(pcVar10,"remove");
            if (iVar3 == 0) {
              unlink(local_498);
            }
          }
        }
      }
      iVar3 = strcmp(uevent.subsystem,"firmware");
      fd = local_4c4;
      if (((iVar3 == 0) && (iVar3 = strcmp(uevent.action,"add"), iVar3 == 0)) &&
         (_Var6 = fork(), _Var6 == 0)) {
        process_firmware_event(&uevent);
        exit(0);
      }
    }
    sVar7 = recv(fd,msg,0x400,0);
    iVar3 = (int)sVar7;
  } while( true );
}

Assistant:

void handle_device_fd(int fd)
{
    char msg[UEVENT_MSG_LEN+2];
    int n;

    while((n = recv(fd, msg, UEVENT_MSG_LEN, 0)) > 0) {
        struct uevent uevent;

        if(n == UEVENT_MSG_LEN)   /* overflow -- discard */
            continue;

        msg[n] = '\0';
        msg[n+1] = '\0';

        parse_event(msg, &uevent);

        handle_device_event(&uevent);
        handle_firmware_event(&uevent);
    }
}